

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O2

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_char,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  long *plVar1;
  data_ptr_t pdVar2;
  idx_t size;
  Vector *pVVar3;
  idx_t i;
  idx_t iVar4;
  idx_t iVar5;
  long lVar6;
  long *plVar7;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  Vector::ToUnifiedFormat(state_vector,count,&local_68);
  size = ListVector::GetListSize(result);
  lVar6 = 0;
  for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
    iVar5 = iVar4;
    if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
      iVar5 = (idx_t)(local_68.sel)->sel_vector[iVar4];
    }
    if (**(long **)(local_68.data + iVar5 * 8) != 0) {
      lVar6 = lVar6 + *(long *)(**(long **)(local_68.data + iVar5 * 8) + 0x18);
    }
  }
  ListVector::Reserve(result,lVar6 + size);
  pVVar3 = ListVector::GetEntry(result);
  pdVar2 = result->data;
  for (iVar4 = 0; iVar4 != count; iVar4 = iVar4 + 1) {
    iVar5 = iVar4;
    if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
      iVar5 = (idx_t)(local_68.sel)->sel_vector[iVar4];
    }
    plVar7 = *(long **)(local_68.data + iVar5 * 8);
    plVar1 = (long *)(pdVar2 + iVar4 * 0x10);
    *(idx_t *)(pdVar2 + iVar4 * 0x10) = size;
    if (*plVar7 == 0) {
      lVar6 = 0;
    }
    else {
      plVar7 = (long *)(*plVar7 + 0x10);
      while (plVar7 = (long *)*plVar7, plVar7 != (long *)0x0) {
        pVVar3->data[size] = *(data_t *)(plVar7 + 1);
        size = size + 1;
      }
      lVar6 = size - *plVar1;
    }
    plVar1[1] = lVar6;
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_68);
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}